

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O2

Aig_Obj_t * Aig_TableLookupInt(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  
  pAVar2 = p0;
  if (p0 != p1) {
    pAVar1 = p->pConst1;
    pAVar2 = (Aig_Obj_t *)((ulong)pAVar1 ^ 1);
    if ((((pAVar2 != p1 && pAVar2 != p0) && ((Aig_Obj_t *)((ulong)p1 ^ 1) != p0)) &&
        (pAVar2 = p1, pAVar1 != p0)) && (pAVar2 = p0, pAVar1 != p1)) {
      if (*(int *)(((ulong)p0 & 0xfffffffffffffffe) + 0x24) <
          *(int *)(((ulong)p1 & 0xfffffffffffffffe) + 0x24)) {
        pAVar2 = p1;
        p1 = p0;
      }
      pAVar2 = Aig_ObjCreateGhost(p,p1,pAVar2,AIG_OBJ_AND);
      pAVar2 = Aig_TableLookup(p,pAVar2);
      return pAVar2;
    }
  }
  return pAVar2;
}

Assistant:

Aig_Obj_t * Aig_TableLookupInt( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1 )
{
    if ( p0 == p1 )
        return p0;
    if ( p0 == Aig_ManConst0(p) || p1 == Aig_ManConst0(p) || p0 == Aig_Not(p1) )
        return Aig_ManConst0(p);
    if ( p0 == Aig_ManConst1(p) )
        return p1;
    if ( p1 == Aig_ManConst1(p) )
        return p0;
    if ( Aig_Regular(p0)->Id < Aig_Regular(p1)->Id )
        return Aig_TableLookup( p, Aig_ObjCreateGhost(p, p0, p1, AIG_OBJ_AND) );
    return Aig_TableLookup( p, Aig_ObjCreateGhost(p, p1, p0, AIG_OBJ_AND) );
}